

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall
kratos::InterfaceVisitor::visit(InterfaceVisitor *this,InterfaceInstantiationStmt *stmt)

{
  InterfaceRef *pIVar1;
  shared_ptr<kratos::IDefinition> *psVar2;
  Generator *gen;
  undefined1 local_28 [8];
  shared_ptr<kratos::IDefinition> def;
  InterfaceInstantiationStmt *stmt_local;
  InterfaceVisitor *this_local;
  
  def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stmt;
  pIVar1 = InterfaceInstantiationStmt::interface(stmt);
  psVar2 = InterfaceRef::definition(pIVar1);
  std::shared_ptr<kratos::IDefinition>::shared_ptr
            ((shared_ptr<kratos::IDefinition> *)local_28,psVar2);
  pIVar1 = InterfaceInstantiationStmt::interface
                     ((InterfaceInstantiationStmt *)
                      def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  gen = Stmt::generator_parent
                  ((Stmt *)def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
  update_interface_definition(this,(shared_ptr<kratos::IDefinition> *)local_28,pIVar1,gen);
  std::shared_ptr<kratos::IDefinition>::~shared_ptr((shared_ptr<kratos::IDefinition> *)local_28);
  return;
}

Assistant:

void visit(InterfaceInstantiationStmt* stmt) override {
        auto def = stmt->interface()->definition();
        update_interface_definition(def, stmt->interface(), stmt->generator_parent());
    }